

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O2

string * __thiscall
re2c::InputAPI::stmt_restorectx_abi_cxx11_
          (string *__return_storage_ptr__,InputAPI *this,uint32_t ind)

{
  opt_t *poVar1;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->type_ == CUSTOM) {
    indent_abi_cxx11_(&local_b0,(re2c *)(ulong)ind,ind);
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    std::operator+(&local_90,&local_b0,&poVar1->yyrestorectx);
    std::operator+(&local_30,&local_90," ();\n");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_90);
    this_00 = &local_b0;
  }
  else {
    if (this->type_ != DEFAULT) {
      return __return_storage_ptr__;
    }
    indent_abi_cxx11_(&local_70,(re2c *)(ulong)ind,ind);
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    std::operator+(&local_50,&local_70,&poVar1->yycursor);
    std::operator+(&local_b0,&local_50," = ");
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    std::operator+(&local_90,&local_b0,&poVar1->yyctxmarker);
    std::operator+(&local_30,&local_90,";\n");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    this_00 = &local_70;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::stmt_restorectx (uint32_t ind) const
{
	std::string s;
	switch (type_)
	{
		case DEFAULT:
			s = indent (ind) + opts->yycursor + " = " + opts->yyctxmarker + ";\n";
			break;
		case CUSTOM:
			s = indent (ind) + opts->yyrestorectx + " ();\n";
			break;
	}
	return s;
}